

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O3

void __thiscall amrex::ClusterList::~ClusterList(ClusterList *this)

{
  _List_node_base *p_Var1;
  iterator End;
  _Node *__tmp;
  _List_node_base *p_Var2;
  
  p_Var2 = (this->lst).super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)this) {
    do {
      operator_delete(*(void **)&((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)
                                 (p_Var2 + 1))->
                                 super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>
                      ,0x30);
      p_Var2 = (((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)&p_Var2->_M_next)->
               super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>)._M_impl.
               _M_node.super__List_node_base._M_next;
    } while (p_Var2 != (_List_node_base *)this);
    p_Var2 = (this->lst).super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>.
             _M_impl._M_node.super__List_node_base._M_next;
  }
  while (p_Var2 != (_List_node_base *)this) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  return;
}

Assistant:

ClusterList::~ClusterList ()
{
    for (std::list<Cluster*>::iterator cli = lst.begin(), End = lst.end();
         cli != End;
         ++cli)
    {
        delete *cli;
    }
}